

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O3

void __thiscall
CommandLineArguments::AddExcludeStrictNameFilter
          (CommandLineArguments *this,int ac,char **av,int *index)

{
  TestFilter *pTVar1;
  int ac_00;
  SimpleString SStack_38;
  
  pTVar1 = (TestFilter *)
           operator_new(0x18,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/build_O3/cpputest-master/src/CppUTest/src/CppUTest/CommandLineArguments.cpp"
                        ,0xd3);
  ac_00 = 0x1b29da;
  SimpleString::SimpleString(&SStack_38,"-xsn");
  getParameterField((CommandLineArguments *)&stack0xffffffffffffffd0,ac_00,(char **)(ulong)(uint)ac,
                    (int *)av,(SimpleString *)index);
  TestFilter::TestFilter(pTVar1,(SimpleString *)&stack0xffffffffffffffd0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd0);
  SimpleString::~SimpleString(&SStack_38);
  TestFilter::invertMatching(pTVar1);
  TestFilter::strictMatching(pTVar1);
  pTVar1 = TestFilter::add(pTVar1,this->nameFilters_);
  this->nameFilters_ = pTVar1;
  return;
}

Assistant:

void CommandLineArguments::AddExcludeStrictNameFilter(int ac, const char** av, int& index)
{
    TestFilter* nameFilter = new TestFilter(getParameterField(ac, av, index, "-xsn"));
    nameFilter->invertMatching();
    nameFilter->strictMatching();
    nameFilters_= nameFilter->add(nameFilters_);
}